

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcEco.c
# Opt level: O1

int Bmc_EcoPatch(Gia_Man_t *p,int nIns,int nOuts)

{
  int iVar1;
  uint uVar2;
  Aig_Man_t *pAig;
  Cnf_Dat_t *pCVar3;
  sat_solver *s;
  Vec_Int_t *pVVar4;
  int *piVar5;
  long lVar6;
  ulong uVar7;
  Vec_Int_t *pVVar8;
  uint uVar9;
  undefined4 in_register_00000014;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  int Lit;
  int local_44;
  ulong local_40;
  ulong local_38;
  
  local_38 = CONCAT44(in_register_00000014,nOuts);
  uVar7 = (ulong)(uint)nIns;
  pAig = Gia_ManToAigSimple(p);
  pAig->nRegs = 0;
  pCVar3 = Cnf_Derive(pAig,pAig->nObjs[3]);
  Aig_ManStop(pAig);
  s = sat_solver_new();
  sat_solver_setnvars(s,pCVar3->nVars);
  lVar6 = 0;
  while (lVar6 < pCVar3->nClauses) {
    iVar1 = sat_solver_addclause(s,pCVar3->pClauses[lVar6],pCVar3->pClauses[lVar6 + 1]);
    lVar6 = lVar6 + 1;
    if (iVar1 == 0) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcEco.c"
                    ,0xd6,"int Bmc_EcoPatch(Gia_Man_t *, int, int)");
    }
  }
  local_40 = uVar7;
  if (p->vCos->nSize - p->nRegs != (int)local_38 + nIns + 1) {
    __assert_fail("Gia_ManPoNum(p) == nOuts + 1 + nIns",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcEco.c"
                  ,0xd8,"int Bmc_EcoPatch(Gia_Man_t *, int, int)");
  }
  pVVar4 = p->vCos;
  uVar2 = pVVar4->nSize;
  uVar7 = (ulong)uVar2;
  uVar11 = local_38 & 0xffffffff;
  uVar9 = uVar2 - p->nRegs;
  uVar10 = (ulong)uVar9;
  if (uVar9 != 0 && p->nRegs <= (int)uVar2) {
    uVar12 = 0;
    do {
      uVar2 = (uint)uVar7;
      if ((long)(int)uVar2 <= (long)uVar12) goto LAB_0052f963;
      iVar1 = pVVar4->pArray[uVar12];
      if (((long)iVar1 < 0) || (p->nObjs <= iVar1)) goto LAB_0052f944;
      if ((uVar11 == uVar12) || (p->pObjs == (Gia_Obj_t *)0x0)) break;
      if (pCVar3->pVarNums[iVar1] < 0) goto LAB_0052f982;
      local_44 = pCVar3->pVarNums[iVar1] * 2 + 1;
      iVar1 = sat_solver_addclause(s,&local_44,(lit *)&local_40);
      if (iVar1 == 0) {
        __assert_fail("RetValue",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcEco.c"
                      ,0xdf,"int Bmc_EcoPatch(Gia_Man_t *, int, int)");
      }
      uVar12 = uVar12 + 1;
      pVVar4 = p->vCos;
      uVar2 = pVVar4->nSize;
      uVar7 = (ulong)(int)uVar2;
      uVar10 = uVar7 - (long)p->nRegs;
    } while ((long)uVar12 < (long)uVar10);
  }
  iVar1 = (int)local_38;
  if ((int)uVar10 <= iVar1) {
    __assert_fail("v < Gia_ManPoNum(p)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                  ,0x1b3,"Gia_Obj_t *Gia_ManPo(Gia_Man_t *, int)");
  }
  if ((-1 < iVar1) && (iVar1 < (int)uVar2)) {
    iVar1 = pVVar4->pArray[uVar11];
    if ((-1 < (long)iVar1) && (iVar1 < p->nObjs)) {
      if (pCVar3->pVarNums[iVar1] < 0) {
LAB_0052f982:
        __assert_fail("Var >= 0 && !(c >> 1)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                      ,0xf1,"int Abc_Var2Lit(int, int)");
      }
      local_44 = pCVar3->pVarNums[iVar1] * 2;
      iVar1 = sat_solver_addclause(s,&local_44,(lit *)&local_40);
      if (iVar1 == 0) {
        __assert_fail("RetValue",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcEco.c"
                      ,0xe5,"int Bmc_EcoPatch(Gia_Man_t *, int, int)");
      }
      iVar1 = sat_solver_simplify(s);
      if (iVar1 == 0) {
        __assert_fail("RetValue",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcEco.c"
                      ,0xe8,"int Bmc_EcoPatch(Gia_Man_t *, int, int)");
      }
      pVVar4 = (Vec_Int_t *)malloc(0x10);
      iVar1 = 0x10;
      if (0xe < (int)local_40 - 1U) {
        iVar1 = (int)local_40;
      }
      pVVar4->nSize = 0;
      pVVar4->nCap = iVar1;
      if (iVar1 == 0) {
        piVar5 = (int *)0x0;
      }
      else {
        piVar5 = (int *)malloc((long)iVar1 << 2);
      }
      pVVar4->pArray = piVar5;
      pVVar8 = p->vCos;
      iVar1 = pVVar8->nSize;
      uVar2 = p->nRegs;
      if ((int)uVar2 < iVar1) {
        uVar7 = 0;
        do {
          if ((long)iVar1 <= (long)uVar7) goto LAB_0052f963;
          iVar1 = pVVar8->pArray[uVar7];
          if (((long)iVar1 < 0) || (p->nObjs <= iVar1)) goto LAB_0052f944;
          if (p->pObjs == (Gia_Obj_t *)0x0) break;
          if (uVar11 < uVar7) {
            if (p->nObjs <= iVar1) {
              __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                            ,0x1b7,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
            }
            Vec_IntPush(pVVar4,pCVar3->pVarNums[iVar1]);
          }
          uVar7 = uVar7 + 1;
          pVVar8 = p->vCos;
          iVar1 = pVVar8->nSize;
          uVar2 = p->nRegs;
        } while ((long)uVar7 < (long)(int)(iVar1 - uVar2));
      }
      if (pVVar4->nSize != (int)local_40) {
        __assert_fail("Vec_IntSize(vVars) == nIns",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcEco.c"
                      ,0xee,"int Bmc_EcoPatch(Gia_Man_t *, int, int)");
      }
      iVar1 = p->vCis->nSize;
      uVar2 = ~uVar2 + iVar1;
      if (((int)uVar2 < 0) || (iVar1 <= (int)uVar2)) goto LAB_0052f963;
      iVar1 = p->vCis->pArray[uVar2];
      if ((-1 < (long)iVar1) && (iVar1 < p->nObjs)) {
        iVar1 = Bmc_EcoSolve(s,pCVar3->pVarNums[iVar1],pVVar4);
        if (pVVar4->pArray != (int *)0x0) {
          free(pVVar4->pArray);
          pVVar4->pArray = (int *)0x0;
        }
        free(pVVar4);
        return iVar1;
      }
    }
LAB_0052f944:
    __assert_fail("v >= 0 && v < p->nObjs",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                  ,0x1af,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
  }
LAB_0052f963:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

int Bmc_EcoPatch( Gia_Man_t * p, int nIns, int nOuts )
{
    int i, Lit, RetValue, Root;
    Gia_Obj_t * pObj;
    Vec_Int_t * vVars;
    // generate CNF and solver
    Cnf_Dat_t * pCnf = Cnf_DeriveGiaRemapped( p );
    sat_solver * pSat = sat_solver_new();
    sat_solver_setnvars( pSat, pCnf->nVars );
    // add timeframe clauses
    for ( i = 0; i < pCnf->nClauses; i++ )
        if ( !sat_solver_addclause( pSat, pCnf->pClauses[i], pCnf->pClauses[i+1] ) )
            assert( 0 );
    // add equality constraints
    assert( Gia_ManPoNum(p) == nOuts + 1 + nIns );
    Gia_ManForEachPo( p, pObj, i )
    {
        if ( i == nOuts )
            break;
        Lit = Abc_Var2Lit( pCnf->pVarNums[Gia_ObjId(p, pObj)], 1 ); // neg lit
        RetValue = sat_solver_addclause( pSat, &Lit, &Lit + 1 );
        assert( RetValue );
    }
    // add inequality constraint
    pObj = Gia_ManPo( p, nOuts );
    Lit = Abc_Var2Lit( pCnf->pVarNums[Gia_ObjId(p, pObj)], 0 ); // pos lit
    RetValue = sat_solver_addclause( pSat, &Lit, &Lit + 1 );
    assert( RetValue );
    // simplify the SAT solver
    RetValue = sat_solver_simplify( pSat );
    assert( RetValue );
    // collect input variables
    vVars = Vec_IntAlloc( nIns );
    Gia_ManForEachPo( p, pObj, i )
        if ( i >= nOuts + 1 )
            Vec_IntPush( vVars, pCnf->pVarNums[Gia_ObjId(p, pObj)] );
    assert( Vec_IntSize(vVars) == nIns );
    // derive the root variable
    pObj = Gia_ManPi( p, Gia_ManPiNum(p) - 1 );
    Root = pCnf->pVarNums[Gia_ObjId(p, pObj)];
    // solve the problem
    RetValue = Bmc_EcoSolve( pSat, Root, vVars );
    Vec_IntFree( vVars );
    return RetValue;
}